

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,Int class_dim,vector<int,_std::allocator<int>_> *class_ids,
          Graph *nodes2ents)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> local_b8 [2];
  Graph local_98;
  undefined1 local_71;
  undefined1 local_70 [8];
  Read<signed_char> eq_marks;
  Graph *nodes2ents_local;
  vector<int,_std::allocator<int>_> *class_ids_local;
  Int class_dim_local;
  Mesh *mesh_local;
  Read<signed_char> *marks;
  
  eq_marks.write_.shared_alloc_.direct_ptr = nodes2ents;
  if ((nodes2ents->a2ab).write_.shared_alloc_.direct_ptr == (void *)0x0) {
    fail("assertion %s failed at %s +%d\n","nodes2ents.a2ab.exists()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
         ,0x8f);
  }
  if ((nodes2ents->ab2b).write_.shared_alloc_.direct_ptr == (void *)0x0) {
    fail("assertion %s failed at %s +%d\n","nodes2ents.ab2b.exists()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
         ,0x90);
  }
  get_eq_marks((Omega_h *)local_70,mesh,class_dim,class_ids);
  local_71 = 0;
  Graph::Graph(&local_98,nodes2ents);
  Read<signed_char>::Read(local_b8,(Read<signed_char> *)local_70);
  mark_down(this,&local_98,local_b8);
  Read<signed_char>::~Read(local_b8);
  Graph::~Graph(&local_98);
  local_71 = 1;
  Read<signed_char>::~Read((Read<signed_char> *)local_70);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_class_closures(Mesh* mesh, Int class_dim,
    std::vector<ClassId> const& class_ids, Graph nodes2ents) {
  OMEGA_H_CHECK(nodes2ents.a2ab.exists());
  OMEGA_H_CHECK(nodes2ents.ab2b.exists());
  auto eq_marks = get_eq_marks(mesh, class_dim, class_ids);
  auto marks = mark_down(nodes2ents, eq_marks);
  return marks;
}